

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createClassConstructorNode(Parser *this,Token *t,Node *parameters_list,Node *function_body)

{
  CompilationContext *ctx_;
  Token *in_RDI;
  Node *n;
  value_type *in_stack_ffffffffffffffa8;
  CompilationContext *__x;
  Node *in_stack_ffffffffffffffc0;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  
  ctx_ = (CompilationContext *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffc0,ctx_,in_RDI);
  *(undefined4 *)
   &(ctx_->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0x39;
  this_00 = (vector<Node_*,_std::allocator<Node_*>_> *)0x0;
  __x = ctx_;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_RDI,in_stack_ffffffffffffffa8);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_00,(value_type *)__x);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_00,(value_type *)__x);
  return (Node *)ctx_;
}

Assistant:

Node * createClassConstructorNode(Token & t, Node * parameters_list, Node * function_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_CLASS_CONSTRUCTOR;
    n->children.push_back(nullptr);
    n->children.push_back(parameters_list);
    n->children.push_back(function_body);
    return n;
  }